

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest16::FunctionalTest16
          (FunctionalTest16 *this,Context *context)

{
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"subroutine_uniform_reset",
             "Checks that when the active program for a shader stage is re-linke or changed by a call to UseProgram, BindProgramPipeline, or UseProgramStages, subroutine uniforms for that stage are reset to arbitrarily chosen default functions with compatible subroutine types."
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01dd26a8;
  this->m_are_pipeline_objects_supported = false;
  this->m_has_test_passed = true;
  this->m_fs_ids[0] = 0;
  this->m_fs_ids[1] = 0;
  this->m_gs_ids[0] = 0;
  this->m_gs_ids[1] = 0;
  this->m_po_ids[0] = 0;
  this->m_po_ids[1] = 0;
  this->m_tc_ids[0] = 0;
  this->m_tc_ids[1] = 0;
  this->m_te_ids[0] = 0;
  this->m_te_ids[1] = 0;
  this->m_vs_ids[0] = 0;
  this->m_vs_ids[1] = 0;
  this->m_fs_po_ids[0] = 0;
  this->m_fs_po_ids[1] = 0;
  this->m_gs_po_ids[0] = 0;
  this->m_gs_po_ids[1] = 0;
  this->m_pipeline_object_ids[0] = 0;
  this->m_pipeline_object_ids[1] = 0;
  this->m_tc_po_ids[0] = 0;
  this->m_tc_po_ids[1] = 0;
  this->m_te_po_ids[0] = 0;
  this->m_te_po_ids[1] = 0;
  this->m_vs_po_ids[0] = 0;
  this->m_vs_po_ids[1] = 0;
  return;
}

Assistant:

FunctionalTest16::FunctionalTest16(deqp::Context& context)
	: TestCase(context, "subroutine_uniform_reset",
			   "Checks that when the active program for a shader stage is re-linke or "
			   "changed by a call to UseProgram, BindProgramPipeline, or UseProgramStages,"
			   " subroutine uniforms for that stage are reset to arbitrarily chosen default "
			   "functions with compatible subroutine types.")
	, m_are_pipeline_objects_supported(false)
	, m_has_test_passed(true)
{
	memset(m_fs_ids, 0, sizeof(m_fs_ids));
	memset(m_gs_ids, 0, sizeof(m_gs_ids));
	memset(m_po_ids, 0, sizeof(m_po_ids));
	memset(m_tc_ids, 0, sizeof(m_tc_ids));
	memset(m_te_ids, 0, sizeof(m_te_ids));
	memset(m_vs_ids, 0, sizeof(m_vs_ids));

	memset(m_fs_po_ids, 0, sizeof(m_fs_po_ids));
	memset(m_gs_po_ids, 0, sizeof(m_gs_po_ids));
	memset(m_pipeline_object_ids, 0, sizeof(m_pipeline_object_ids));
	memset(m_tc_po_ids, 0, sizeof(m_tc_po_ids));
	memset(m_te_po_ids, 0, sizeof(m_te_po_ids));
	memset(m_vs_po_ids, 0, sizeof(m_vs_po_ids));
}